

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::buildTimeMap(MidiFile *this)

{
  pointer *pp_Var1;
  int iVar2;
  int iVar3;
  pointer p_Var4;
  iterator __position;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MidiEvent *pMVar9;
  _TickTime value;
  double local_60;
  double local_58;
  double local_48;
  _TickTime local_40;
  
  iVar2 = this->m_theTrackState;
  iVar3 = this->m_theTimeState;
  makeAbsoluteTicks(this);
  joinTracks(this);
  iVar6 = MidiEventList::size(*(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::reserve
            (&this->m_timemap,(long)(iVar6 + 10));
  p_Var4 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var4) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var4;
  }
  iVar6 = this->m_ticksPerQuarterNote;
  iVar7 = MidiEventList::size(*(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  if (0 < iVar7) {
    local_48 = 60.0 / ((double)iVar6 * 120.0);
    local_60 = 0.0;
    iVar6 = 0;
    local_58 = 0.0;
    bVar5 = false;
    iVar7 = 0;
    do {
      pMVar9 = MidiEventList::operator[]
                         (*(this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,iVar7);
      iVar8 = pMVar9->tick;
      pMVar9 = MidiEventList::operator[]
                         (*(this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,iVar7);
      pMVar9->seconds = local_60;
      if ((!bVar5) || (iVar6 < iVar8)) {
        local_60 = (double)(iVar8 - iVar6) * local_48 + local_58;
        pMVar9 = MidiEventList::operator[]
                           (*(this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar7);
        pMVar9->seconds = local_60;
        __position._M_current =
             (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        iVar6 = iVar8;
        local_58 = local_60;
        local_40.tick = iVar8;
        local_40.seconds = local_60;
        if (__position._M_current ==
            (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<smf::_TickTime,std::allocator<smf::_TickTime>>::
          _M_realloc_insert<smf::_TickTime_const&>
                    ((vector<smf::_TickTime,std::allocator<smf::_TickTime>> *)&this->m_timemap,
                     __position,&local_40);
        }
        else {
          *(ulong *)__position._M_current = CONCAT44(local_40._4_4_,iVar8);
          (__position._M_current)->seconds = local_60;
          pp_Var1 = &(this->m_timemap).
                     super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
      }
      pMVar9 = MidiEventList::operator[]
                         (*(this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,iVar7);
      bVar5 = MidiMessage::isTempo(&pMVar9->super_MidiMessage);
      if (bVar5) {
        pMVar9 = MidiEventList::operator[]
                           (*(this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,iVar7);
        local_48 = MidiMessage::getTempoSPT(&pMVar9->super_MidiMessage,this->m_ticksPerQuarterNote);
      }
      iVar7 = iVar7 + 1;
      iVar8 = MidiEventList::size(*(this->m_events).
                                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      bVar5 = true;
    } while (iVar7 < iVar8);
  }
  if (iVar3 == 0) {
    makeDeltaTicks(this);
  }
  if (iVar2 == 0) {
    splitTracks(this);
  }
  this->m_timemapvalid = true;
  return;
}

Assistant:

void MidiFile::buildTimeMap(void) {

	// convert the MIDI file to absolute time representation
	// in single track mode (and undo if the MIDI file was not
	// in that state when this function was called.
	//
	int trackstate = getTrackState();
	int timestate  = getTickState();

	makeAbsoluteTicks();
	joinTracks();

	int allocsize = getNumEvents(0);
	m_timemap.reserve(allocsize+10);
	m_timemap.clear();

	_TickTime value;

	int lasttick = 0;
	int tickinit = 0;

	int i;
	int tpq = getTicksPerQuarterNote();
	double defaultTempo = 120.0;
	double secondsPerTick = 60.0 / (defaultTempo * tpq);

	double lastsec = 0.0;
	double cursec = 0.0;

	for (i=0; i<getNumEvents(0); i++) {
		int curtick = getEvent(0, i).tick;
		getEvent(0, i).seconds = cursec;
		if ((curtick > lasttick) || !tickinit) {
			tickinit = 1;

			// calculate the current time in seconds:
			cursec = lastsec + (curtick - lasttick) * secondsPerTick;
			getEvent(0, i).seconds = cursec;

			// store the new tick to second mapping
			value.tick = curtick;
			value.seconds = cursec;
			m_timemap.push_back(value);
			lasttick   = curtick;
			lastsec    = cursec;
		}

		// update the tempo if needed:
		if (getEvent(0,i).isTempo()) {
			secondsPerTick = getEvent(0,i).getTempoSPT(getTicksPerQuarterNote());
		}
	}

	// reset the states of the tracks or time values if necessary here:
	if (timestate == TIME_STATE_DELTA) {
		deltaTicks();
	}
	if (trackstate == TRACK_STATE_SPLIT) {
		splitTracks();
	}

	m_timemapvalid = 1;

}